

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O0

string * embree::toLowerCase(string *s)

{
  string *in_RSI;
  string *in_RDI;
  string *dst;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  
  __result._M_current = (char *)in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__result,(_func_char_char *)in_RDI)
  ;
  return in_RDI;
}

Assistant:

std::string toLowerCase(const std::string& s) { std::string dst(s); std::transform(dst.begin(), dst.end(), dst.begin(), to_lower); return dst; }